

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median_filter.cc
# Opt level: O3

bool __thiscall
sptk::MedianFilter::Get(MedianFilter *this,vector<double,_std::allocator<double>_> *output)

{
  bool bVar1;
  _Elt_pointer pvVar2;
  pointer pdVar3;
  pointer pdVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  bool bVar5;
  int iVar6;
  _Elt_pointer pvVar7;
  int iVar8;
  long lVar9;
  _Map_pointer ppvVar10;
  int iVar11;
  _Elt_pointer pvVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  _Iter_less_iter local_51;
  vector<double,_std::allocator<double>_> *local_50;
  size_type local_48;
  long local_40;
  ulong local_38;
  
  bVar5 = false;
  if ((output != (vector<double,_std::allocator<double>_> *)0x0) &&
     (bVar5 = false, this->is_valid_ != false)) {
    local_50 = output;
    bVar5 = Forward(this);
    if (bVar5) {
      iVar6 = (*(this->super_InputSourceInterface)._vptr_InputSourceInterface[2])(this);
      local_48 = (size_type)iVar6;
      if ((long)(local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != local_48) {
        std::vector<double,_std::allocator<double>_>::resize(local_50,local_48);
      }
      if (0 < iVar6) {
        uVar15 = 0;
        do {
          pvVar7 = (this->queue_).
                   super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          pvVar2 = (this->queue_).
                   super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          iVar6 = 0;
          if (pvVar7 == pvVar2) {
LAB_00105681:
            __first._M_current =
                 (this->flat_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
            lVar14 = (long)(iVar6 / 2);
            std::
            __heap_select<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (__first._M_current,__first._M_current + lVar14 + 1,__first._M_current + iVar6
                      );
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (__first,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                )(__first._M_current + lVar14 + 1),&local_51);
            bVar5 = IsEven(iVar6);
            pdVar3 = (this->flat_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (bVar5) {
              dVar16 = (pdVar3[lVar14 + -1] + pdVar3[lVar14]) * 0.5;
            }
            else {
              dVar16 = pdVar3[lVar14];
            }
          }
          else {
            ppvVar10 = (this->queue_).
                       super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_node;
            pvVar12 = (this->queue_).
                      super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last;
            bVar5 = this->apply_each_dimension_;
            iVar11 = 0;
            local_38 = 0;
            if (bVar5 != false) {
              local_38 = uVar15 & 0xffffffff;
            }
            bVar1 = this->use_magic_number_;
            iVar13 = this->num_input_order_;
            local_40 = local_38 - 1;
            iVar6 = 0;
            do {
              if ((bVar5 != false) || ((int)local_38 <= iVar13)) {
                pdVar3 = (this->flat_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar4 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                lVar14 = local_40;
                do {
                  if ((bVar1 & 1U) == 0) {
                    dVar16 = pdVar4[lVar14 + 1];
LAB_00105633:
                    lVar9 = (long)iVar6;
                    iVar6 = iVar6 + 1;
                    pdVar3[lVar9] = dVar16;
                    iVar13 = this->num_input_order_;
                  }
                  else {
                    dVar16 = pdVar4[lVar14 + 1];
                    if ((this->magic_number_ != dVar16) || (NAN(this->magic_number_) || NAN(dVar16))
                       ) goto LAB_00105633;
                    iVar11 = iVar11 + 1;
                  }
                  iVar8 = iVar13;
                  if (bVar5 != false) {
                    iVar8 = (int)uVar15;
                  }
                  lVar14 = lVar14 + 1;
                } while (lVar14 < iVar8);
              }
              pvVar7 = pvVar7 + 1;
              if (pvVar7 == pvVar12) {
                pvVar7 = ppvVar10[1];
                ppvVar10 = ppvVar10 + 1;
                pvVar12 = pvVar7 + 0x15;
              }
            } while (pvVar7 != pvVar2);
            if (iVar11 <= iVar6) goto LAB_00105681;
            dVar16 = this->magic_number_;
          }
          (local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar15] = dVar16;
          uVar15 = uVar15 + 1;
        } while (uVar15 != local_48);
      }
      if ((this->count_down_ < this->num_filter_order_ / 2) ||
         (ppvVar10 = (this->queue_).
                     super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node, bVar5 = true,
         this->num_filter_order_ <
         (int)((int)((ulong)((long)(this->queue_).
                                   super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)(this->queue_).
                                  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) *
               -0x55555555 +
               (int)((ulong)((long)(this->queue_).
                                   super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)(this->queue_).
                                  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) *
               -0x55555555 +
              ((int)((ulong)((long)ppvVar10 -
                            (long)(this->queue_).
                                  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
              (uint)(ppvVar10 == (_Map_pointer)0x0)) * 0x15))) {
        std::
        deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::pop_front(&this->queue_);
        bVar5 = true;
      }
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool MedianFilter::Get(std::vector<double>* output) {
  if (!is_valid_ || NULL == output) {
    return false;
  }

  if (!Forward()) {
    return false;
  }

  const int output_size(GetSize());
  if (output->size() != static_cast<std::size_t>(output_size)) {
    output->resize(output_size);
  }

  for (int m(0); m < output_size; ++m) {
    int num_magic_numbers(0);
    int num_valid_numbers(0);
    for (const std::vector<double>& input_vector : queue_) {
      for (int n(apply_each_dimension_ ? m : 0);
           n <= (apply_each_dimension_ ? m : num_input_order_); ++n) {
        if (use_magic_number_ && magic_number_ == input_vector[n]) {
          ++num_magic_numbers;
        } else {
          flat_[num_valid_numbers++] = input_vector[n];
        }
      }
    }

    if (num_valid_numbers < num_magic_numbers) {
      (*output)[m] = magic_number_;
      continue;
    }

    const int half_size(num_valid_numbers / 2);
    std::partial_sort(flat_.begin(), flat_.begin() + half_size + 1,
                      flat_.begin() + num_valid_numbers);
    if (IsEven(num_valid_numbers)) {
      (*output)[m] = 0.5 * (flat_[half_size - 1] + flat_[half_size]);
    } else {
      (*output)[m] = flat_[half_size];
    }
  }

  if (count_down_ < num_filter_order_ / 2 ||
      num_filter_order_ + 1 <= static_cast<int>(queue_.size())) {
    queue_.pop_front();
  }

  return true;
}